

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::ExternalPartitionTestDfsAPI_SendFeatures_Test::
~ExternalPartitionTestDfsAPI_SendFeatures_Test(ExternalPartitionTestDfsAPI_SendFeatures_Test *this)

{
  ExternalPartitionTestDfsAPI_SendFeatures_Test *in_stack_00000010;
  
  anon_unknown.dwarf_87c1cb::ExternalPartitionTestDfsAPI_SendFeatures_Test::
  ~ExternalPartitionTestDfsAPI_SendFeatures_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(ExternalPartitionTestDfsAPI, SendFeatures) {
  ::libaom_test::Y4mVideoSource video("paris_352_288_30.y4m", 0, kFrameNum);
  SetExternalPartition(true);
  SetTestSendFeatures(0);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

  SetExternalPartition(true);
  SetTestSendFeatures(1);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  if (!WRITE_FEATURE_TO_FILE) return;

  // Compare feature files by reading them into strings.
  for (int i = 0; i < 8; ++i) {
    std::ifstream base_file(feature_file_names[i]);
    ASSERT_TRUE(base_file.good());
    std::stringstream base_stream;
    base_stream << base_file.rdbuf();
    std::string base_string = base_stream.str();

    std::ifstream test_file(test_feature_file_names[i]);
    ASSERT_TRUE(test_file.good());
    std::stringstream test_stream;
    test_stream << test_file.rdbuf();
    std::string test_string = test_stream.str();

    EXPECT_STREQ(base_string.c_str(), test_string.c_str());
  }

  // Remove files.
  std::string command("rm -f feature_* test_feature_*");
  system(command.c_str());
}